

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O3

int coda_path_find_file(char *searchpath,char *filename,char **location)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *__ptr;
  size_t sVar4;
  char *pcVar5;
  char *__s;
  char *pcVar6;
  int iVar7;
  char *__ptr_00;
  stat sb;
  int local_c8;
  stat local_c0;
  
  sVar3 = strlen(filename);
  if ((searchpath != (char *)0x0) && (*searchpath != '\0')) {
    __ptr = strdup(searchpath);
    if (__ptr == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                     ,0x187);
      return -1;
    }
    cVar1 = *__ptr;
    if (cVar1 != '\0') {
      iVar7 = 0;
      pcVar6 = __ptr;
      __ptr_00 = (char *)0x0;
      __s = __ptr;
LAB_00137c22:
      do {
        pcVar5 = pcVar6 + 1;
        if (cVar1 != '\0') {
          if (cVar1 != ':') {
            cVar1 = *pcVar5;
            pcVar6 = pcVar5;
            goto LAB_00137c22;
          }
          *pcVar6 = '\0';
          pcVar6 = pcVar5;
        }
        sVar4 = strlen(__s);
        local_c8 = (int)sVar3;
        local_c8 = (int)sVar4 + local_c8;
        pcVar5 = __ptr_00;
        if (iVar7 <= local_c8) {
          pcVar5 = (char *)realloc(__ptr_00,(long)(local_c8 + 2));
          if (pcVar5 == (char *)0x0) {
            coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                           ,0x1a5);
            if (__ptr_00 != (char *)0x0) {
              free(__ptr_00);
              return -1;
            }
            return -1;
          }
          iVar7 = local_c8 + 1;
        }
        sprintf(pcVar5,"%s/%s",__s,filename);
        iVar2 = stat(pcVar5,&local_c0);
        if ((iVar2 == 0) && ((local_c0.st_mode._1_1_ & 0x80) != 0)) {
          *location = pcVar5;
          free(__ptr);
          return 0;
        }
        cVar1 = *pcVar6;
        __ptr_00 = pcVar5;
        __s = pcVar6;
      } while (cVar1 != '\0');
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
    }
    free(__ptr);
  }
  *location = (char *)0x0;
  return 0;
}

Assistant:

int coda_path_find_file(const char *searchpath, const char *filename, char **location)
{
#ifdef WIN32
    const char path_separator_char = ';';
#else
    const char path_separator_char = ':';
#endif
    char *path;
    char *path_component;
    char *filepath = NULL;
    int filepath_length = 0;
    int filename_length = (int)strlen(filename);

    if (searchpath == NULL || searchpath[0] == '\0')
    {
        *location = NULL;
        return 0;
    }

    path = strdup(searchpath);
    if (path == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path_component = path;
    while (*path_component != '\0')
    {
        struct stat sb;
        char *p;
        int path_component_length;

        p = path_component;
        while (*p != '\0' && *p != path_separator_char)
        {
            p++;
        }
        if (*p != '\0')
        {
            *p = '\0';
            p++;
        }

        path_component_length = (int)strlen(path_component);
        if (filepath_length < path_component_length + filename_length + 1)
        {
            char *new_filepath;

            new_filepath = realloc(filepath, path_component_length + filename_length + 2);
            if (new_filepath == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                               __LINE__);
                if (filepath != NULL)
                {
                    free(filepath);
                }
                return -1;
            }
            filepath = new_filepath;
            filepath_length = path_component_length + filename_length + 1;
        }
        sprintf(filepath, "%s/%s", path_component, filename);

        if (stat(filepath, &sb) == 0)
        {
            if (sb.st_mode & S_IFREG)
            {
                /* we found the file */
                *location = filepath;
                free(path);
                return 0;
            }
        }

        path_component = p;
    }

    if (filepath != NULL)
    {
        free(filepath);
    }
    free(path);

    /* the file was not found */
    *location = NULL;
    return 0;
}